

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O0

int __thiscall QUrlQueryPrivate::findRecodedKey(QUrlQueryPrivate *this,QString *key,int from)

{
  bool bVar1;
  QList<std::pair<QString,_QString>_> *this_00;
  qsizetype qVar2;
  int in_EDX;
  long in_RDI;
  int i;
  QString *in_stack_ffffffffffffffc8;
  int local_20;
  
  local_20 = in_EDX;
  while( true ) {
    this_00 = (QList<std::pair<QString,_QString>_> *)(long)local_20;
    qVar2 = QList<std::pair<QString,_QString>_>::size
                      ((QList<std::pair<QString,_QString>_> *)(in_RDI + 8));
    if (qVar2 <= (long)this_00) {
      qVar2 = QList<std::pair<QString,_QString>_>::size
                        ((QList<std::pair<QString,_QString>_> *)(in_RDI + 8));
      return (int)qVar2;
    }
    QList<std::pair<QString,_QString>_>::at(this_00,(qsizetype)in_stack_ffffffffffffffc8);
    bVar1 = ::operator==((QString *)this_00,in_stack_ffffffffffffffc8);
    if (bVar1) break;
    local_20 = local_20 + 1;
  }
  return local_20;
}

Assistant:

int findRecodedKey(const QString &key, int from = 0) const
    {
        for (int i = from; i < itemList.size(); ++i)
            if (itemList.at(i).first == key)
                return i;
        return itemList.size();
    }